

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

word Mio_DeriveTruthTable6(Mio_Gate_t *pGate)

{
  int in_ECX;
  anon_union_8_2_94730283 uTruthRes;
  word local_10;
  
  if (pGate->nInputs < 7) {
    Mio_DeriveTruthTable
              (pGate,Mio_DeriveTruthTable6::uTruths6,pGate->nInputs,in_ECX,(uint *)&local_10);
    return local_10;
  }
  __assert_fail("pGate->nInputs <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                ,0x359,"word Mio_DeriveTruthTable6(Mio_Gate_t *)");
}

Assistant:

word Mio_DeriveTruthTable6( Mio_Gate_t * pGate )
{
    static unsigned uTruths6[6][2] = {
        { 0xAAAAAAAA, 0xAAAAAAAA },
        { 0xCCCCCCCC, 0xCCCCCCCC },
        { 0xF0F0F0F0, 0xF0F0F0F0 },
        { 0xFF00FF00, 0xFF00FF00 },
        { 0xFFFF0000, 0xFFFF0000 },
        { 0x00000000, 0xFFFFFFFF }
    };
    union {
      unsigned u[2];
      word w;
    } uTruthRes;
    assert( pGate->nInputs <= 6 );
    Mio_DeriveTruthTable( pGate, uTruths6, pGate->nInputs, 6, uTruthRes.u );
    return uTruthRes.w;
}